

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O2

bool __thiscall libebml::EbmlElement::ForceSize(EbmlElement *this,uint64 NewSize)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  if (this->bSizeIsFinite == false) {
    uVar1 = this->Size;
    uVar2 = this->SizeLength;
    if (uVar1 < 0x80) {
      uVar3 = 1;
    }
    else if (uVar1 < 0x4000) {
      uVar3 = 2;
    }
    else if (uVar1 < 0x200000) {
      uVar3 = 3;
    }
    else {
      uVar3 = 5 - (uVar1 < 0x10000000);
    }
    if (uVar3 <= uVar2) {
      uVar3 = uVar2;
    }
    this->Size = NewSize;
    uVar2 = CodedSizeLength(NewSize,uVar2,false);
    if (uVar2 != uVar3) {
      this->Size = uVar1;
    }
    else {
      this->bSizeIsFinite = true;
    }
    return uVar2 == uVar3;
  }
  return false;
}

Assistant:

bool EbmlElement::ForceSize(uint64 NewSize)
{
  if (bSizeIsFinite) {
    return false;
  }

  int OldSizeLen = CodedSizeLength(Size, SizeLength, bSizeIsFinite);
  uint64 OldSize = Size;

  Size = NewSize;

  if (CodedSizeLength(Size, SizeLength, bSizeIsFinite) == OldSizeLen) {
    bSizeIsFinite = true;
    return true;
  }
  Size = OldSize;

  return false;
}